

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QToolBarAreaLayoutItem>::growAppend
          (QCommonArrayOps<QToolBarAreaLayoutItem> *this,QToolBarAreaLayoutItem *b,
          QToolBarAreaLayoutItem *e)

{
  long lVar1;
  bool bVar2;
  QToolBarAreaLayoutItem *e_00;
  QToolBarAreaLayoutItem *in_RDX;
  QToolBarAreaLayoutItem *in_RSI;
  QPodArrayOps<QToolBarAreaLayoutItem> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<QToolBarAreaLayoutItem> *c;
  GrowthPosition where;
  QToolBarAreaLayoutItem *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    e_00 = (QToolBarAreaLayoutItem *)(((long)in_RDX - (long)in_RSI) / 0x18);
    c = (QCommonArrayOps<QToolBarAreaLayoutItem> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QToolBarAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QToolBarAreaLayoutItem>::QArrayDataPointer
              ((QArrayDataPointer<QToolBarAreaLayoutItem> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<QToolBarAreaLayoutItem>,QToolBarAreaLayoutItem_const*>
                      ((QToolBarAreaLayoutItem **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<QToolBarAreaLayoutItem>::detachAndGrow
                ((QArrayDataPointer<QToolBarAreaLayoutItem> *)this_00,where,(qsizetype)in_RDI,
                 (QToolBarAreaLayoutItem **)in_RDX,(QArrayDataPointer<QToolBarAreaLayoutItem> *)e_00
                );
    }
    else {
      QArrayDataPointer<QToolBarAreaLayoutItem>::detachAndGrow
                ((QArrayDataPointer<QToolBarAreaLayoutItem> *)this_00,where,(qsizetype)in_RDI,
                 (QToolBarAreaLayoutItem **)in_RDX,(QArrayDataPointer<QToolBarAreaLayoutItem> *)e_00
                );
    }
    QPodArrayOps<QToolBarAreaLayoutItem>::copyAppend(in_RDI,in_RDX,e_00);
    QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer
              ((QArrayDataPointer<QToolBarAreaLayoutItem> *)e_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }